

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix.c
# Opt level: O1

size_t cilkos_getenv(char *value,size_t vallen,char *varname)

{
  char *dest;
  rsize_t rVar1;
  
  if (value == (char *)0x0) {
    cilkos_getenv_cold_2();
  }
  else if (varname != (char *)0x0) {
    dest = getenv(varname);
    if (dest == (char *)0x0) {
      *value = '\0';
      rVar1 = 0;
    }
    else {
      rVar1 = strnlen_s(dest,0x1000);
      if (vallen - 1 < rVar1) {
        rVar1 = rVar1 + 1;
      }
      else {
        strcpy_s(value,vallen,dest);
      }
    }
    return rVar1;
  }
  cilkos_getenv_cold_1();
}

Assistant:

size_t cilkos_getenv(char* value, __STDNS size_t vallen,
                                           const char* varname)
{
    CILK_ASSERT(value);
    CILK_ASSERT(varname);

    const char* envstr = getenv(varname);
    if (envstr)
    {
        size_t len = cilk_strlen(envstr);
        if (len > vallen - 1)
            return len + 1;
        cilk_strcpy_s(value, vallen, envstr);
        return len;
    }
    else
    {
        value[0] = '\0';
        return 0;
    }
}